

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidget::~QRhiWidget(QRhiWidget *this)

{
  QRhiWidgetPrivate *this_00;
  undefined8 *in_RDI;
  QRhiWidgetPrivate *d;
  QWidget *in_stack_00000078;
  
  *in_RDI = &PTR_metaObject_00d05f20;
  in_RDI[2] = &PTR__QRhiWidget_00d060e8;
  this_00 = d_func((QRhiWidget *)0x3479ea);
  if (this_00->rhi != (QRhi *)0x0) {
    QRhi::removeCleanupCallback(this_00->rhi);
    QRhiWidgetPrivate::resetRenderTargetObjects(this_00);
    QRhiWidgetPrivate::resetColorBufferObjects(this_00);
    qDeleteAll<QList<QRhiResource*>>((QList<QRhiResource_*> *)this_00);
  }
  QBackingStoreRhiSupport::reset();
  QWidget::~QWidget(in_stack_00000078);
  return;
}

Assistant:

QRhiWidget::~QRhiWidget()
{
    Q_D(QRhiWidget);

    if (d->rhi) {
        d->rhi->removeCleanupCallback(this);
        // rhi resources must be destroyed here, due to how QWidget teardown works;
        // it should not be left to the private object's destruction.
        d->resetRenderTargetObjects();
        d->resetColorBufferObjects();
        qDeleteAll(d->pendingDeletes);
    }

    d->offscreenRenderer.reset();
}